

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_combine(bcf_hdr_t *dst,bcf_hdr_t *src)

{
  int iVar1;
  kh_vdict_t *h;
  kh_vdict_t *h_00;
  int iVar2;
  khint_t kVar3;
  khint_t kVar4;
  bcf_hrec_t *pbVar5;
  khint_t k_dst;
  khint_t k_src;
  vdict_t *d_dst;
  vdict_t *d_src;
  bcf_hrec_t *rec_1;
  int j_2;
  bcf_hrec_t *rec;
  int j_1;
  int j;
  int ret;
  int need_sync;
  int ndst_ori;
  int i;
  bcf_hdr_t *src_local;
  bcf_hdr_t *dst_local;
  
  iVar1 = dst->nhrec;
  j = 0;
  j_1 = 0;
  need_sync = 0;
  do {
    if (src->nhrec <= need_sync) {
      if (j != 0) {
        bcf_hdr_sync(dst);
      }
      return j_1;
    }
    if ((src->hrec[need_sync]->type == 5) && (src->hrec[need_sync]->value != (char *)0x0)) {
      rec._4_4_ = 0;
      while ((rec._4_4_ < iVar1 &&
             ((dst->hrec[rec._4_4_]->type != 5 ||
              (iVar2 = strcmp(src->hrec[need_sync]->key,dst->hrec[rec._4_4_]->key), iVar2 != 0)))))
      {
        rec._4_4_ = rec._4_4_ + 1;
      }
      if (iVar1 <= rec._4_4_) {
        pbVar5 = bcf_hrec_dup(src->hrec[need_sync]);
        iVar2 = bcf_hdr_add_hrec(dst,pbVar5);
        j = iVar2 + j;
      }
    }
    else if (src->hrec[need_sync]->type == 4) {
      iVar2 = bcf_hrec_find_key(src->hrec[need_sync],"ID");
      if ((-1 < iVar2) &&
         (pbVar5 = bcf_hdr_get_hrec(dst,src->hrec[need_sync]->type,"ID",
                                    src->hrec[need_sync]->vals[iVar2],src->hrec[need_sync]->key),
         pbVar5 == (bcf_hrec_t *)0x0)) {
        pbVar5 = bcf_hrec_dup(src->hrec[need_sync]);
        iVar2 = bcf_hdr_add_hrec(dst,pbVar5);
        j = iVar2 + j;
      }
    }
    else {
      iVar2 = bcf_hrec_find_key(src->hrec[need_sync],"ID");
      if (iVar2 < 0) {
        __assert_fail("j>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0x8c4,"int bcf_hdr_combine(bcf_hdr_t *, const bcf_hdr_t *)");
      }
      pbVar5 = bcf_hdr_get_hrec(dst,src->hrec[need_sync]->type,"ID",
                                src->hrec[need_sync]->vals[iVar2],(char *)0x0);
      if (pbVar5 == (bcf_hrec_t *)0x0) {
        pbVar5 = bcf_hrec_dup(src->hrec[need_sync]);
        iVar2 = bcf_hdr_add_hrec(dst,pbVar5);
        j = iVar2 + j;
      }
      else if ((src->hrec[need_sync]->type == 1) || (src->hrec[need_sync]->type == 2)) {
        h = (kh_vdict_t *)src->dict[0];
        h_00 = (kh_vdict_t *)dst->dict[0];
        kVar3 = kh_get_vdict(h,*src->hrec[need_sync]->vals);
        kVar4 = kh_get_vdict(h_00,*src->hrec[need_sync]->vals);
        if ((h->vals[kVar3].info[pbVar5->type] >> 8 & 0xf) !=
            (h_00->vals[kVar4].info[pbVar5->type] >> 8 & 0xf)) {
          fprintf(_stderr,"Warning: trying to combine \"%s\" tag definitions of different lengths\n"
                  ,*src->hrec[need_sync]->vals);
          j_1 = 1;
        }
        if ((h->vals[kVar3].info[pbVar5->type] >> 4 & 0xf) !=
            (h_00->vals[kVar4].info[pbVar5->type] >> 4 & 0xf)) {
          fprintf(_stderr,"Warning: trying to combine \"%s\" tag definitions of different types\n",
                  *src->hrec[need_sync]->vals);
          j_1 = 1;
        }
      }
    }
    need_sync = need_sync + 1;
  } while( true );
}

Assistant:

int bcf_hdr_combine(bcf_hdr_t *dst, const bcf_hdr_t *src)
{
    int i, ndst_ori = dst->nhrec, need_sync = 0, ret = 0;
    for (i=0; i<src->nhrec; i++)
    {
        if ( src->hrec[i]->type==BCF_HL_GEN && src->hrec[i]->value )
        {
            int j;
            for (j=0; j<ndst_ori; j++)
            {
                if ( dst->hrec[j]->type!=BCF_HL_GEN ) continue;

                // Checking only the key part of generic lines, otherwise
                // the VCFs are too verbose. Should we perhaps add a flag
                // to bcf_hdr_combine() and make this optional?
                if ( !strcmp(src->hrec[i]->key,dst->hrec[j]->key) ) break;
            }
            if ( j>=ndst_ori )
                need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
        }
        else if ( src->hrec[i]->type==BCF_HL_STR )
        {
            // NB: we are ignoring fields without ID
            int j = bcf_hrec_find_key(src->hrec[i],"ID");
            if ( j>=0 )
            {
                bcf_hrec_t *rec = bcf_hdr_get_hrec(dst, src->hrec[i]->type, "ID", src->hrec[i]->vals[j], src->hrec[i]->key);
                if ( !rec )
                    need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
            }
        }
        else
        {
            int j = bcf_hrec_find_key(src->hrec[i],"ID");
            assert( j>=0 ); // this should always be true for valid VCFs

            bcf_hrec_t *rec = bcf_hdr_get_hrec(dst, src->hrec[i]->type, "ID", src->hrec[i]->vals[j], NULL);
            if ( !rec )
                need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
            else if ( src->hrec[i]->type==BCF_HL_INFO || src->hrec[i]->type==BCF_HL_FMT )
            {
                // Check that both records are of the same type. The bcf_hdr_id2length
                // macro cannot be used here because dst header is not synced yet.
                vdict_t *d_src = (vdict_t*)src->dict[BCF_DT_ID];
                vdict_t *d_dst = (vdict_t*)dst->dict[BCF_DT_ID];
                khint_t k_src  = kh_get(vdict, d_src, src->hrec[i]->vals[0]);
                khint_t k_dst  = kh_get(vdict, d_dst, src->hrec[i]->vals[0]);
                if ( (kh_val(d_src,k_src).info[rec->type]>>8 & 0xf) != (kh_val(d_dst,k_dst).info[rec->type]>>8 & 0xf) )
                {
                    fprintf(stderr,"Warning: trying to combine \"%s\" tag definitions of different lengths\n", src->hrec[i]->vals[0]);
                    ret |= 1;
                }
                if ( (kh_val(d_src,k_src).info[rec->type]>>4 & 0xf) != (kh_val(d_dst,k_dst).info[rec->type]>>4 & 0xf) )
                {
                    fprintf(stderr,"Warning: trying to combine \"%s\" tag definitions of different types\n", src->hrec[i]->vals[0]);
                    ret |= 1;
                }
            }
        }
    }
    if ( need_sync ) bcf_hdr_sync(dst);
    return ret;
}